

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManCutMatchPrint(Nf_Man_t *p,int iObj,char *pStr,Nf_Mat_t *pM)

{
  int *piVar1;
  Mio_Cell2_t *pMVar2;
  uint uVar3;
  char *pcVar4;
  byte bVar5;
  ulong uVar6;
  
  printf("%5d %s : ");
  if ((*(uint *)pM & 0x3ff00000) == 0) {
    puts("Unassigned");
    return;
  }
  pMVar2 = p->pCells + (*(uint *)pM & 0xfffff);
  piVar1 = Nf_ObjCutSet(p,iObj);
  piVar1 = Nf_CutFromHandle(piVar1,*(uint *)pM >> 0x14 & 0x3ff);
  printf("D =%6.2f  ",
         (double)(float)((double)((uint)pM->D & 0x3fffffff) * 0.001 +
                        (double)(pM->D >> 0x1e & 0xffffffff) * 1073741.824));
  printf("A =%6.2f  ",
         (double)(float)((double)((uint)pM->A & 0x3fffffff) * 0.001 +
                        (double)(pM->A >> 0x1e & 0xffffffff) * 1073741.824));
  printf("C = %d ",(ulong)(*(uint *)pM >> 0x1e & 1));
  printf("  ");
  printf("Cut = {");
  for (uVar6 = 0; uVar6 < *(uint *)&pMVar2->field_0x10 >> 0x1c; uVar6 = uVar6 + 1) {
    printf("%4d ",(ulong)(uint)piVar1[uVar6 + 1]);
  }
  for (; (uint)uVar6 < 6; uVar6 = (ulong)((uint)uVar6 + 1)) {
    printf("     ");
  }
  printf("}  ");
  printf("%10s ",pMVar2->pName);
  printf("%d  ",(ulong)(*(uint *)&pMVar2->field_0x10 >> 0x1c));
  putchar(0x7b);
  for (uVar6 = 0; uVar6 < *(uint *)&pMVar2->field_0x10 >> 0x1c; uVar6 = uVar6 + 1) {
    printf("%6.2f ",(double)(float)((double)((uint)pMVar2->Delays[uVar6] & 0x3fffffff) * 0.001 +
                                   (double)(pMVar2->Delays[uVar6] >> 0x1e & 0xffffffff) *
                                   1073741.824));
  }
  for (; (uint)uVar6 < 6; uVar6 = (ulong)((uint)uVar6 + 1)) {
    printf("       ");
  }
  printf(" } ");
  bVar5 = 0;
  for (uVar3 = 0; uVar3 < *(uint *)&pMVar2->field_0x10 >> 0x1c; uVar3 = uVar3 + 1) {
    pcVar4 = "!";
    if ((1 << ((byte)uVar3 & 0x1f) & (uint)pM->Cfg >> 1 & 0x7f) == 0) {
      pcVar4 = " ";
    }
    printf("%s%d ",pcVar4,(ulong)(((uint)pM->Cfg >> 8) >> (bVar5 & 0x1f) & 0xf));
    bVar5 = bVar5 + 4;
  }
  for (; uVar3 < 6; uVar3 = uVar3 + 1) {
    printf("  ");
  }
  Dau_DsdPrintFromTruth(&pMVar2->uTruth,*(uint *)&pMVar2->field_0x10 >> 0x1c);
  return;
}

Assistant:

void Nf_ManCutMatchPrint( Nf_Man_t * p, int iObj, char * pStr, Nf_Mat_t * pM )
{
    Mio_Cell2_t * pCell;
    int i, * pCut;
    printf( "%5d %s : ", iObj, pStr );
    if ( pM->CutH == 0 )
    {
        printf( "Unassigned\n" );
        return;
    }
    pCell = Nf_ManCell( p, pM->Gate );
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, iObj), pM->CutH );
    printf( "D =%6.2f  ", Nf_Wrd2Flt(pM->D) );
    printf( "A =%6.2f  ", Nf_Wrd2Flt(pM->A) );
    printf( "C = %d ", pM->fCompl );
//    printf( "B = %d ", pM->fBest );
    printf( "  " );
    printf( "Cut = {" );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        printf( "%4d ", Nf_CutLeaves(pCut)[i] );
    for ( ; i < 6; i++ )
        printf( "     " );
    printf( "}  " );
    printf( "%10s ", pCell->pName );
    printf( "%d  ", pCell->nFanins );
    printf( "{" );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        printf( "%6.2f ", Nf_Wrd2Flt(pCell->Delays[i]) );
    for ( ; i < 6; i++ )
        printf( "       " );
    printf( " } " );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        printf( "%s%d ", Nf_CfgCompl(pM->Cfg, i) ? "!":" ", Nf_CfgVar(pM->Cfg, i) );
    for ( ; i < 6; i++ )
        printf( "  " );
    Dau_DsdPrintFromTruth( &pCell->uTruth, pCell->nFanins );
}